

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

char * __thiscall CServer::ClientName(CServer *this,int ClientID)

{
  int ClientID_local;
  CServer *this_local;
  char *local_8;
  
  if (((ClientID < 0) || (0x3f < ClientID)) || (this->m_aClients[ClientID].m_State == 0)) {
    local_8 = "(invalid)";
  }
  else if (this->m_aClients[ClientID].m_State == 5) {
    local_8 = this->m_aClients[ClientID].m_aName;
  }
  else {
    local_8 = "(connecting)";
  }
  return local_8;
}

Assistant:

const char *CServer::ClientName(int ClientID) const
{
	if(ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CServer::CClient::STATE_EMPTY)
		return "(invalid)";
	if(m_aClients[ClientID].m_State == CServer::CClient::STATE_INGAME)
		return m_aClients[ClientID].m_aName;
	else
		return "(connecting)";

}